

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_client_request.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::drop_all_pending_commit_elems(raft_server *this)

{
  element_type *peVar1;
  _Base_ptr p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined8 uVar4;
  int iVar5;
  _Base_ptr p_Var6;
  uint64_t uVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _List_node_base *p_Var10;
  ptr<buffer> result;
  element_type *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  shared_ptr<std::exception> local_68;
  map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
  *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
  elems;
  
  nuraft::context::get_params((context *)&result);
  iVar5 = *(int *)(result.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                  0x58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&result.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (iVar5 == 0) {
    std::mutex::lock(&this->commit_ret_elems_lock_);
    local_58 = &this->commit_ret_elems_;
    p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff;
    _Var9._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    for (p_Var6 = (this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      result.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      result.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)
                 &p_Var6[1]._M_parent[5]._M_parent,
                 &result.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&result.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      p_Var2 = p_Var6[1]._M_parent;
      *(undefined4 *)&p_Var2[5]._M_right = 0xffffffff;
      EventAwaiter::invoke((EventAwaiter *)&p_Var2->_M_parent);
      p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)p_Var6[1]._M_parent;
      if (p_Var3 <= p_Var8) {
        p_Var8 = p_Var3;
      }
      if (_Var9._M_pi <= p_Var3) {
        _Var9._M_pi = p_Var3;
      }
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar1 != (element_type *)0x0) {
        iVar5 = (*peVar1->_vptr_logger[7])();
        if (4 < iVar5) {
          peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar4 = *(undefined8 *)p_Var6[1]._M_parent;
          local_50._M_pi = _Var9._M_pi;
          uVar7 = timer_helper::get_us((timer_helper *)&p_Var6[1]._M_parent[3]._M_parent);
          msg_if_given_abi_cxx11_
                    ((string *)&result,"cancelled blocking client request %lu, waited %lu us",uVar4,
                     uVar7);
          (*peVar1->_vptr_logger[8])
                    (peVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                     ,"drop_all_pending_commit_elems",0x119,&result);
          std::__cxx11::string::~string((string *)&result);
          _Var9._M_pi = local_50._M_pi;
        }
      }
    }
    if (((this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
       (peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
       peVar1 != (element_type *)0x0)) {
      iVar5 = (*peVar1->_vptr_logger[7])();
      if (2 < iVar5) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&result,"cancelled %zu blocking client requests from %lu to %lu.",
                   (this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header._M_node_count,p_Var8
                   ,_Var9._M_pi);
        (*peVar1->_vptr_logger[8])
                  (peVar1,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                   ,"drop_all_pending_commit_elems",0x11e,&result);
        std::__cxx11::string::~string((string *)&result);
      }
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
    ::clear(&local_58->_M_t);
    pthread_mutex_unlock((pthread_mutex_t *)&this->commit_ret_elems_lock_);
  }
  else {
    elems.
    super__List_base<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&elems;
    elems.
    super__List_base<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
    ._M_impl._M_node._M_size = 0;
    elems.
    super__List_base<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         elems.
         super__List_base<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    std::mutex::lock(&this->commit_ret_elems_lock_);
    for (p_Var6 = (this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      std::__cxx11::
      list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
      ::push_back(&elems,(value_type *)&p_Var6[1]._M_parent);
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
    ::clear(&(this->commit_ret_elems_)._M_t);
    pthread_mutex_unlock((pthread_mutex_t *)&this->commit_ret_elems_lock_);
    p_Var10 = (_List_node_base *)&elems;
    while (p_Var10 = (((_List_base<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
                        *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var10 != (_List_node_base *)&elems) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar1 != (element_type *)0x0) {
        iVar5 = (*peVar1->_vptr_logger[7])();
        if (2 < iVar5) {
          peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&result,"cancelled non-blocking client request %lu",
                     (p_Var10[1]._M_next)->_M_next);
          (*peVar1->_vptr_logger[8])
                    (peVar1,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                     ,"drop_all_pending_commit_elems",0x133,&result);
          std::__cxx11::string::~string((string *)&result);
        }
      }
      result.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      result.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::make_shared<std::runtime_error,char_const(&)[19]>((char (*) [19])&local_78);
      local_68.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_78;
      local_68.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Stack_70._M_pi;
      local_78 = (element_type *)0x0;
      _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_70);
      cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::set_result
                (*(cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> **)
                  ((long)p_Var10[1]._M_next + 0xc0),&result,&local_68,CANCELLED);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_68.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&result.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
    }
    std::__cxx11::
    _List_base<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
    ::_M_clear(&elems.
                super__List_base<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
              );
  }
  return;
}

Assistant:

void raft_server::drop_all_pending_commit_elems() {
    // Blocking mode:
    //   Invoke all awaiting requests to return `CANCELLED`.
    if (ctx_->get_params()->return_method_ == raft_params::blocking) {
        auto_lock(commit_ret_elems_lock_);
        ulong min_idx = std::numeric_limits<ulong>::max();
        ulong max_idx = 0;
        for (auto& entry: commit_ret_elems_) {
            ptr<commit_ret_elem>& elem = entry.second;
            elem->ret_value_ = nullptr;
            elem->result_code_ = cmd_result_code::CANCELLED;
            elem->awaiter_.invoke();
            if (min_idx > elem->idx_) {
                min_idx = elem->idx_;
            }
            if (max_idx < elem->idx_) {
                max_idx = elem->idx_;
            }
            p_db("cancelled blocking client request %" PRIu64 ", waited %" PRIu64 " us",
                 elem->idx_, elem->timer_.get_us());
        }
        if (!commit_ret_elems_.empty()) {
            p_wn("cancelled %zu blocking client requests from %" PRIu64
                 " to %" PRIu64 ".",
                 commit_ret_elems_.size(), min_idx, max_idx);
        }
        commit_ret_elems_.clear();
        return;
    }

    // Non-blocking mode:
    //   Set `CANCELLED` and set result & error.
    std::list< ptr<commit_ret_elem> > elems;

    {   auto_lock(commit_ret_elems_lock_);
        for (auto& entry: commit_ret_elems_) {
            ptr<commit_ret_elem>& ee = entry.second;
            elems.push_back(ee);
        }
        commit_ret_elems_.clear();
    }

    // Calling handler should be done outside the mutex.
    for (auto& entry: elems) {
        ptr<commit_ret_elem>&ee = entry;
        p_wn("cancelled non-blocking client request %" PRIu64, ee->idx_);

        ptr<buffer> result = nullptr;
        ptr<std::exception> err =
            cs_new<std::runtime_error>("Request cancelled.");
        ee->async_result_->set_result(result, err, cmd_result_code::CANCELLED);
    }
}